

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DwaCompressor::LossyDctEncoderCsc::LossyDctEncoderCsc
          (LossyDctEncoderCsc *this,float quantBaseError,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsR,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsG,
          vector<const_char_*,_std::allocator<const_char_*>_> *rowPtrsB,char *packedAc,
          char *packedDc,unsigned_short *toNonlinear,int width,int height,PixelType typeR,
          PixelType typeG,PixelType typeB)

{
  vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *this_00;
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  *this_01;
  iterator iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  (this->super_LossyDctEncoderBase)._vptr_LossyDctEncoderBase =
       (_func_int **)&PTR__LossyDctEncoderBase_0315fa50;
  (this->super_LossyDctEncoderBase)._quantBaseError = quantBaseError;
  (this->super_LossyDctEncoderBase)._width = width;
  (this->super_LossyDctEncoderBase)._height = height;
  (this->super_LossyDctEncoderBase)._toNonlinear = toNonlinear;
  (this->super_LossyDctEncoderBase)._numAcComp = 0;
  (this->super_LossyDctEncoderBase)._numDcComp = 0;
  (this->super_LossyDctEncoderBase)._rowPtrs.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._rowPtrs.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._rowPtrs.
  super__Vector_base<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._type.
  super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._dctData.
  super__Vector_base<Imf_2_5::SimdAlignedBuffer64<float>,_std::allocator<Imf_2_5::SimdAlignedBuffer64<float>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LossyDctEncoderBase)._packedAc = packedAc;
  (this->super_LossyDctEncoderBase)._packedDc = packedDc;
  auVar3 = _DAT_02ee7860;
  auVar2 = _DAT_02ee7850;
  lVar4 = 0;
  do {
    auVar5._0_4_ = (float)*(int *)(&DAT_02f07bc0 + lVar4);
    auVar5._4_4_ = (float)*(int *)(&UNK_02f07bc4 + lVar4);
    auVar5._8_4_ = (float)*(int *)(&UNK_02f07bc8 + lVar4);
    auVar5._12_4_ = (float)*(int *)(&UNK_02f07bcc + lVar4);
    auVar5 = divps(auVar5,auVar2);
    *(undefined1 (*) [16])((long)(this->super_LossyDctEncoderBase)._quantTableY + lVar4) = auVar5;
    auVar6._0_4_ = (float)*(int *)(&DAT_02f07cc0 + lVar4);
    auVar6._4_4_ = (float)*(int *)(&UNK_02f07cc4 + lVar4);
    auVar6._8_4_ = (float)*(int *)(&UNK_02f07cc8 + lVar4);
    auVar6._12_4_ = (float)*(int *)(&UNK_02f07ccc + lVar4);
    auVar5 = divps(auVar6,auVar3);
    *(undefined1 (*) [16])((long)(this->super_LossyDctEncoderBase)._quantTableCbCr + lVar4) = auVar5
    ;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x100);
  (this->super_LossyDctEncoderBase)._vptr_LossyDctEncoderBase =
       (_func_int **)&PTR__LossyDctEncoderBase_0315faf8;
  this_00 = &(this->super_LossyDctEncoderBase)._type;
  iVar1._M_current =
       (this->super_LossyDctEncoderBase)._type.
       super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->super_LossyDctEncoderBase)._type.
      super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
    _M_realloc_insert<Imf_2_5::PixelType_const&>
              ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)this_00,iVar1,&typeR
              );
  }
  else {
    *iVar1._M_current = typeR;
    (this->super_LossyDctEncoderBase)._type.
    super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->super_LossyDctEncoderBase)._type.
       super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->super_LossyDctEncoderBase)._type.
      super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
    _M_realloc_insert<Imf_2_5::PixelType_const&>
              ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)this_00,iVar1,&typeG
              );
  }
  else {
    *iVar1._M_current = typeG;
    (this->super_LossyDctEncoderBase)._type.
    super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  iVar1._M_current =
       (this->super_LossyDctEncoderBase)._type.
       super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar1._M_current ==
      (this->super_LossyDctEncoderBase)._type.
      super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>>::
    _M_realloc_insert<Imf_2_5::PixelType_const&>
              ((vector<Imf_2_5::PixelType,std::allocator<Imf_2_5::PixelType>> *)this_00,iVar1,&typeB
              );
  }
  else {
    *iVar1._M_current = typeB;
    (this->super_LossyDctEncoderBase)._type.
    super__Vector_base<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar1._M_current + 1;
  }
  this_01 = &(this->super_LossyDctEncoderBase)._rowPtrs;
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back(this_01,rowPtrsR);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back(this_01,rowPtrsG);
  std::
  vector<std::vector<const_char_*,_std::allocator<const_char_*>_>,_std::allocator<std::vector<const_char_*,_std::allocator<const_char_*>_>_>_>
  ::push_back(this_01,rowPtrsB);
  return;
}

Assistant:

LossyDctEncoderCsc
        (float quantBaseError,
         std::vector<const char *> &rowPtrsR,
         std::vector<const char *> &rowPtrsG,
         std::vector<const char *> &rowPtrsB,
         char *packedAc,
         char *packedDc,
         const unsigned short *toNonlinear,
         int width,
         int height,
         PixelType typeR,
         PixelType typeG,
         PixelType typeB)
    :
        LossyDctEncoderBase
            (quantBaseError, packedAc, packedDc, toNonlinear, width, height)
    {
        _type.push_back(typeR);
        _type.push_back(typeG);
        _type.push_back(typeB);

        _rowPtrs.push_back(rowPtrsR);
        _rowPtrs.push_back(rowPtrsG);
        _rowPtrs.push_back(rowPtrsB);
    }